

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::UnaryExpression::evalImpl
          (ConstantValue *__return_storage_ptr__,UnaryExpression *this,EvalContext *context)

{
  bitwidth_t *__return_storage_ptr___00;
  UnaryOperator UVar1;
  bool bVar2;
  SVInt *pSVar3;
  Expression *pEVar4;
  logic_error *plVar5;
  string local_770;
  allocator<char> local_749;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  SVInt local_6a8;
  shortreal_t local_698;
  shortreal_t local_694;
  shortreal_t local_690;
  float local_68c;
  undefined1 local_688 [4];
  float v_5;
  real_t local_678;
  real_t local_670;
  real_t local_668;
  double local_660;
  double v_4;
  SVInt local_650;
  logic_t local_63a;
  uint8_t local_639;
  SVInt local_638;
  logic_t local_622;
  uint8_t local_621;
  SVInt local_620;
  logic_t local_60a;
  uint8_t local_609;
  SVInt local_608;
  uint8_t local_5f1;
  SVInt local_5f0;
  uint8_t local_5d9;
  SVInt local_5d8;
  uint8_t local_5c1;
  SVInt local_5c0;
  SVInt local_5b0;
  SVInt local_5a0;
  undefined1 local_590 [8];
  SVInt v_3;
  ConstantValue cv;
  string local_550;
  allocator<char> local_529;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  shortreal_t local_488;
  shortreal_t local_484;
  ConstantValue local_480;
  shortreal_t local_458;
  shortreal_t local_454;
  ConstantValue local_450;
  shortreal_t local_428;
  shortreal_t local_424;
  ConstantValue local_420;
  shortreal_t local_3f8;
  shortreal_t local_3f4;
  ConstantValue local_3f0;
  shortreal_t local_3c8;
  float local_3c4;
  real_t rStack_3c0;
  float v_2;
  real_t local_3b8;
  ConstantValue local_3b0;
  real_t local_388;
  real_t local_380;
  ConstantValue local_378;
  real_t local_350;
  real_t local_348;
  ConstantValue local_340;
  real_t local_318;
  real_t local_310;
  ConstantValue local_308;
  real_t local_2e0;
  double local_2d8;
  double v_1;
  SVInt local_2c0;
  ConstantValue local_2b0;
  SVInt local_288;
  SVInt local_278;
  ConstantValue local_268;
  ConstantValue local_240;
  ConstantValue local_218;
  undefined1 local_1f0 [8];
  SVInt v;
  ConstantValue cv_1;
  undefined1 local_1a8 [8];
  LValue lvalue;
  EvalContext *context_local;
  UnaryExpression *this_local;
  
  lvalue.value.
  super__Variant_base<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>_>
  .
  super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
  .
  super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
  .
  super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
  .
  super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
  .
  super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
  ._384_8_ = context;
  bVar2 = anon_unknown.dwarf_df6558::isLValueOp(this->op);
  if (bVar2) {
    pEVar4 = operand(this);
    Expression::evalLValue
              ((LValue *)local_1a8,pEVar4,
               (EvalContext *)
               lvalue.value.
               super__Variant_base<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>_>
               .
               super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
               .
               super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
               .
               super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
               .
               super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
               .
               super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
               ._384_8_);
    bVar2 = LValue::operator_cast_to_bool((LValue *)local_1a8);
    if (bVar2) {
      LValue::load((ConstantValue *)&v.super_SVIntStorage.bitWidth,(LValue *)local_1a8);
      bVar2 = slang::ConstantValue::operator_cast_to_bool
                        ((ConstantValue *)&v.super_SVIntStorage.bitWidth);
      if (bVar2) {
        bVar2 = slang::ConstantValue::isInteger((ConstantValue *)&v.super_SVIntStorage.bitWidth);
        if (bVar2) {
          slang::ConstantValue::integer((ConstantValue *)local_1f0);
          switch(this->op) {
          case Preincrement:
            pSVar3 = SVInt::operator++((SVInt *)local_1f0);
            slang::ConstantValue::ConstantValue(&local_218,pSVar3);
            LValue::store((LValue *)local_1a8,&local_218);
            slang::ConstantValue::~ConstantValue(&local_218);
            slang::ConstantValue::ConstantValue(__return_storage_ptr__,(SVInt *)local_1f0);
            bVar2 = true;
            break;
          case Predecrement:
            pSVar3 = SVInt::operator--((SVInt *)local_1f0);
            slang::ConstantValue::ConstantValue(&local_240,pSVar3);
            LValue::store((LValue *)local_1a8,&local_240);
            slang::ConstantValue::~ConstantValue(&local_240);
            slang::ConstantValue::ConstantValue(__return_storage_ptr__,(SVInt *)local_1f0);
            bVar2 = true;
            break;
          case Postincrement:
            SVInt::SVInt<int,void>(&local_288,1);
            SVInt::operator+(&local_278,(SVInt *)local_1f0);
            slang::ConstantValue::ConstantValue(&local_268,&local_278);
            LValue::store((LValue *)local_1a8,&local_268);
            slang::ConstantValue::~ConstantValue(&local_268);
            SVInt::~SVInt(&local_278);
            SVInt::~SVInt(&local_288);
            slang::ConstantValue::ConstantValue(__return_storage_ptr__,(SVInt *)local_1f0);
            bVar2 = true;
            break;
          case Postdecrement:
            SVInt::SVInt<int,void>((SVInt *)&v_1,1);
            SVInt::operator-(&local_2c0,(SVInt *)local_1f0);
            slang::ConstantValue::ConstantValue(&local_2b0,&local_2c0);
            LValue::store((LValue *)local_1a8,&local_2b0);
            slang::ConstantValue::~ConstantValue(&local_2b0);
            SVInt::~SVInt(&local_2c0);
            SVInt::~SVInt((SVInt *)&v_1);
            slang::ConstantValue::ConstantValue(__return_storage_ptr__,(SVInt *)local_1f0);
            bVar2 = true;
            break;
          default:
            bVar2 = false;
          }
          SVInt::~SVInt((SVInt *)local_1f0);
          if (!bVar2) goto switchD_006863d3_default;
        }
        else {
          bVar2 = slang::ConstantValue::isReal((ConstantValue *)&v.super_SVIntStorage.bitWidth);
          if (bVar2) {
            local_2e0 = slang::ConstantValue::real((ConstantValue *)&v.super_SVIntStorage.bitWidth);
            local_2d8 = real_t::operator_cast_to_double(&local_2e0);
            switch(this->op) {
            case Preincrement:
              local_2d8 = local_2d8 + 1.0;
              real_t::real_t(&local_310,local_2d8);
              slang::ConstantValue::ConstantValue(&local_308,local_310);
              LValue::store((LValue *)local_1a8,&local_308);
              slang::ConstantValue::~ConstantValue(&local_308);
              real_t::real_t(&local_318,local_2d8);
              slang::ConstantValue::ConstantValue(__return_storage_ptr__,local_318);
              break;
            case Predecrement:
              local_2d8 = local_2d8 + -1.0;
              real_t::real_t(&local_348,local_2d8);
              slang::ConstantValue::ConstantValue(&local_340,local_348);
              LValue::store((LValue *)local_1a8,&local_340);
              slang::ConstantValue::~ConstantValue(&local_340);
              real_t::real_t(&local_350,local_2d8);
              slang::ConstantValue::ConstantValue(__return_storage_ptr__,local_350);
              break;
            case Postincrement:
              real_t::real_t(&local_380,local_2d8 + 1.0);
              slang::ConstantValue::ConstantValue(&local_378,local_380);
              LValue::store((LValue *)local_1a8,&local_378);
              slang::ConstantValue::~ConstantValue(&local_378);
              real_t::real_t(&local_388,local_2d8);
              slang::ConstantValue::ConstantValue(__return_storage_ptr__,local_388);
              break;
            case Postdecrement:
              real_t::real_t(&local_3b8,local_2d8 + -1.0);
              slang::ConstantValue::ConstantValue(&local_3b0,local_3b8);
              LValue::store((LValue *)local_1a8,&local_3b0);
              slang::ConstantValue::~ConstantValue(&local_3b0);
              real_t::real_t(&stack0xfffffffffffffc40,local_2d8);
              slang::ConstantValue::ConstantValue(__return_storage_ptr__,rStack_3c0);
              break;
            default:
              goto switchD_006863d3_default;
            }
          }
          else {
            bVar2 = slang::ConstantValue::isShortReal
                              ((ConstantValue *)&v.super_SVIntStorage.bitWidth);
            if (!bVar2) {
switchD_006863d3_default:
              plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_528,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
                         ,&local_529);
              std::operator+(&local_508,&local_528,":");
              std::__cxx11::to_string(&local_550,0x202);
              std::operator+(&local_4e8,&local_508,&local_550);
              std::operator+(&local_4c8,&local_4e8,": ");
              std::operator+(&local_4a8,&local_4c8,"Default case should be unreachable!");
              std::logic_error::logic_error(plVar5,(string *)&local_4a8);
              __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            local_3c8 = slang::ConstantValue::shortReal
                                  ((ConstantValue *)&v.super_SVIntStorage.bitWidth);
            local_3c4 = shortreal_t::operator_cast_to_float(&local_3c8);
            switch(this->op) {
            case Preincrement:
              local_3c4 = local_3c4 + 1.0;
              shortreal_t::shortreal_t(&local_3f4,local_3c4);
              slang::ConstantValue::ConstantValue(&local_3f0,local_3f4);
              LValue::store((LValue *)local_1a8,&local_3f0);
              slang::ConstantValue::~ConstantValue(&local_3f0);
              shortreal_t::shortreal_t(&local_3f8,local_3c4);
              slang::ConstantValue::ConstantValue(__return_storage_ptr__,local_3f8);
              break;
            case Predecrement:
              local_3c4 = local_3c4 + -1.0;
              shortreal_t::shortreal_t(&local_424,local_3c4);
              slang::ConstantValue::ConstantValue(&local_420,local_424);
              LValue::store((LValue *)local_1a8,&local_420);
              slang::ConstantValue::~ConstantValue(&local_420);
              shortreal_t::shortreal_t(&local_428,local_3c4);
              slang::ConstantValue::ConstantValue(__return_storage_ptr__,local_428);
              break;
            case Postincrement:
              shortreal_t::shortreal_t(&local_454,local_3c4 + 1.0);
              slang::ConstantValue::ConstantValue(&local_450,local_454);
              LValue::store((LValue *)local_1a8,&local_450);
              slang::ConstantValue::~ConstantValue(&local_450);
              shortreal_t::shortreal_t(&local_458,local_3c4);
              slang::ConstantValue::ConstantValue(__return_storage_ptr__,local_458);
              break;
            case Postdecrement:
              shortreal_t::shortreal_t(&local_484,local_3c4 + -1.0);
              slang::ConstantValue::ConstantValue(&local_480,local_484);
              LValue::store((LValue *)local_1a8,&local_480);
              slang::ConstantValue::~ConstantValue(&local_480);
              shortreal_t::shortreal_t(&local_488,local_3c4);
              slang::ConstantValue::ConstantValue(__return_storage_ptr__,local_488);
              break;
            default:
              goto switchD_006863d3_default;
            }
          }
        }
      }
      else {
        slang::ConstantValue::ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
      }
      slang::ConstantValue::~ConstantValue((ConstantValue *)&v.super_SVIntStorage.bitWidth);
    }
    else {
      slang::ConstantValue::ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
    }
    LValue::~LValue((LValue *)local_1a8);
  }
  else {
    pEVar4 = operand(this);
    __return_storage_ptr___00 = &v_3.super_SVIntStorage.bitWidth;
    Expression::eval((ConstantValue *)__return_storage_ptr___00,pEVar4,
                     (EvalContext *)
                     lvalue.value.
                     super__Variant_base<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue,_std::allocator<slang::ast::LValue>_>_>
                     .
                     super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
                     .
                     super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
                     .
                     super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
                     .
                     super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
                     .
                     super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_std::vector<slang::ast::LValue>_>
                     ._384_8_);
    bVar2 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)__return_storage_ptr___00);
    if (bVar2) {
      bVar2 = slang::ConstantValue::isInteger((ConstantValue *)&v_3.super_SVIntStorage.bitWidth);
      if (bVar2) {
        slang::ConstantValue::integer((ConstantValue *)local_590);
        switch(this->op) {
        case Plus:
          slang::ConstantValue::ConstantValue(__return_storage_ptr__,(SVInt *)local_590);
          bVar2 = true;
          break;
        case Minus:
          SVInt::operator-(&local_5a0);
          slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_5a0);
          SVInt::~SVInt(&local_5a0);
          bVar2 = true;
          break;
        case BitwiseNot:
          SVInt::operator~(&local_5b0);
          slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_5b0);
          SVInt::~SVInt(&local_5b0);
          bVar2 = true;
          break;
        case BitwiseAnd:
          local_5c1 = (uint8_t)SVInt::reductionAnd((SVInt *)local_590);
          SVInt::SVInt(&local_5c0,(logic_t)local_5c1);
          slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_5c0);
          SVInt::~SVInt(&local_5c0);
          bVar2 = true;
          break;
        case BitwiseOr:
          local_5d9 = (uint8_t)SVInt::reductionOr((SVInt *)local_590);
          SVInt::SVInt(&local_5d8,(logic_t)local_5d9);
          slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_5d8);
          SVInt::~SVInt(&local_5d8);
          bVar2 = true;
          break;
        case BitwiseXor:
          local_5f1 = (uint8_t)SVInt::reductionXor((SVInt *)local_590);
          SVInt::SVInt(&local_5f0,(logic_t)local_5f1);
          slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_5f0);
          SVInt::~SVInt(&local_5f0);
          bVar2 = true;
          break;
        case BitwiseNand:
          local_60a = SVInt::reductionAnd((SVInt *)local_590);
          local_609 = (uint8_t)logic_t::operator!(&local_60a);
          SVInt::SVInt(&local_608,(logic_t)local_609);
          slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_608);
          SVInt::~SVInt(&local_608);
          bVar2 = true;
          break;
        case BitwiseNor:
          local_622 = SVInt::reductionOr((SVInt *)local_590);
          local_621 = (uint8_t)logic_t::operator!(&local_622);
          SVInt::SVInt(&local_620,(logic_t)local_621);
          slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_620);
          SVInt::~SVInt(&local_620);
          bVar2 = true;
          break;
        case BitwiseXnor:
          local_63a = SVInt::reductionXor((SVInt *)local_590);
          local_639 = (uint8_t)logic_t::operator!(&local_63a);
          SVInt::SVInt(&local_638,(logic_t)local_639);
          slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_638);
          SVInt::~SVInt(&local_638);
          bVar2 = true;
          break;
        case LogicalNot:
          v_4._7_1_ = SVInt::operator!((SVInt *)local_590);
          SVInt::SVInt(&local_650,v_4._7_1_);
          slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_650);
          SVInt::~SVInt(&local_650);
          bVar2 = true;
          break;
        default:
          bVar2 = false;
        }
        SVInt::~SVInt((SVInt *)local_590);
        if (!bVar2) {
LAB_0068729c:
          plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_748,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
                     ,&local_749);
          std::operator+(&local_728,&local_748,":");
          std::__cxx11::to_string(&local_770,0x234);
          std::operator+(&local_708,&local_728,&local_770);
          std::operator+(&local_6e8,&local_708,": ");
          std::operator+(&local_6c8,&local_6e8,"Default case should be unreachable!");
          std::logic_error::logic_error(plVar5,(string *)&local_6c8);
          __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
      }
      else {
        bVar2 = slang::ConstantValue::isReal((ConstantValue *)&v_3.super_SVIntStorage.bitWidth);
        if (bVar2) {
          local_668 = slang::ConstantValue::real((ConstantValue *)&v_3.super_SVIntStorage.bitWidth);
          local_660 = real_t::operator_cast_to_double(&local_668);
          UVar1 = this->op;
          if (UVar1 == Plus) {
            real_t::real_t(&local_670,local_660);
            slang::ConstantValue::ConstantValue(__return_storage_ptr__,local_670);
          }
          else if (UVar1 == Minus) {
            real_t::real_t(&local_678,-local_660);
            slang::ConstantValue::ConstantValue(__return_storage_ptr__,local_678);
          }
          else {
            if (UVar1 != LogicalNot) goto LAB_0068729c;
            SVInt::SVInt<bool,void>((SVInt *)local_688,(bool)(-(local_660 == 0.0) & 1));
            slang::ConstantValue::ConstantValue(__return_storage_ptr__,(SVInt *)local_688);
            SVInt::~SVInt((SVInt *)local_688);
          }
        }
        else {
          bVar2 = slang::ConstantValue::isShortReal
                            ((ConstantValue *)&v_3.super_SVIntStorage.bitWidth);
          if (!bVar2) goto LAB_0068729c;
          local_690 = slang::ConstantValue::shortReal
                                ((ConstantValue *)&v_3.super_SVIntStorage.bitWidth);
          local_68c = shortreal_t::operator_cast_to_float(&local_690);
          UVar1 = this->op;
          if (UVar1 == Plus) {
            shortreal_t::shortreal_t(&local_694,local_68c);
            slang::ConstantValue::ConstantValue(__return_storage_ptr__,local_694);
          }
          else if (UVar1 == Minus) {
            shortreal_t::shortreal_t(&local_698,-local_68c);
            slang::ConstantValue::ConstantValue(__return_storage_ptr__,local_698);
          }
          else {
            if (UVar1 != LogicalNot) goto LAB_0068729c;
            SVInt::SVInt<bool,void>(&local_6a8,(bool)(-(local_68c == 0.0) & 1));
            slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_6a8);
            SVInt::~SVInt(&local_6a8);
          }
        }
      }
    }
    else {
      slang::ConstantValue::ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
    }
    slang::ConstantValue::~ConstantValue((ConstantValue *)&v_3.super_SVIntStorage.bitWidth);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue UnaryExpression::evalImpl(EvalContext& context) const {
    // Handle operations that require an lvalue up front.
    if (isLValueOp(op)) {
        LValue lvalue = operand().evalLValue(context);
        if (!lvalue)
            return nullptr;

        ConstantValue cv = lvalue.load();
        if (!cv)
            return nullptr;

        if (cv.isInteger()) {
#define OP(k, val)         \
    case UnaryOperator::k: \
        lvalue.store(val); \
        return v

            SVInt v = std::move(cv).integer();
            switch (op) {
                OP(Preincrement, ++v);
                OP(Predecrement, --v);
                OP(Postincrement, v + 1);
                OP(Postdecrement, v - 1);
                default:
                    break;
            }
#undef OP
        }
        else if (cv.isReal()) {
#define OP(k, val)                 \
    case UnaryOperator::k:         \
        lvalue.store(real_t(val)); \
        return real_t(v)

            double v = cv.real();
            switch (op) {
                OP(Preincrement, ++v);
                OP(Predecrement, --v);
                OP(Postincrement, v + 1);
                OP(Postdecrement, v - 1);
                default:
                    break;
            }
#undef OP
        }
        else if (cv.isShortReal()) {
#define OP(k, val)                      \
    case UnaryOperator::k:              \
        lvalue.store(shortreal_t(val)); \
        return shortreal_t(v)

            float v = cv.shortReal();
            switch (op) {
                OP(Preincrement, ++v);
                OP(Predecrement, --v);
                OP(Postincrement, v + 1);
                OP(Postdecrement, v - 1);
                default:
                    break;
            }
#undef OP
        }

        ASSUME_UNREACHABLE;
    }

    ConstantValue cv = operand().eval(context);
    if (!cv)
        return nullptr;

#define OP(k, v)           \
    case UnaryOperator::k: \
        return v;

    if (cv.isInteger()) {
        SVInt v = std::move(cv).integer();
        switch (op) {
            OP(Plus, v);
            OP(Minus, -v);
            OP(BitwiseNot, ~v);
            OP(BitwiseAnd, SVInt(v.reductionAnd()));
            OP(BitwiseOr, SVInt(v.reductionOr()));
            OP(BitwiseXor, SVInt(v.reductionXor()));
            OP(BitwiseNand, SVInt(!v.reductionAnd()));
            OP(BitwiseNor, SVInt(!v.reductionOr()));
            OP(BitwiseXnor, SVInt(!v.reductionXor()));
            OP(LogicalNot, SVInt(!v));
            default:
                break;
        }
    }
    else if (cv.isReal()) {
        double v = cv.real();
        switch (op) {
            OP(Plus, real_t(v));
            OP(Minus, real_t(-v));
            OP(LogicalNot, SVInt(!(bool)v));
            default:
                break;
        }
    }
    else if (cv.isShortReal()) {
        float v = cv.shortReal();
        switch (op) {
            OP(Plus, shortreal_t(v));
            OP(Minus, shortreal_t(-v));
            OP(LogicalNot, SVInt(!(bool)v));
            default:
                break;
        }
    }

#undef OP
    ASSUME_UNREACHABLE;
}